

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_then_execute.cpp
# Opt level: O1

void test_then_execute<has_then_execute_free_function>(has_then_execute_free_function *exec)

{
  int iVar1;
  anon_class_8_1_6971b95b_for_func *f;
  anon_class_8_1_f8e7f5fd_for_func *f_00;
  int result;
  executor_future_t<has_then_execute_free_function,_typename_std::result_of<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:88:75)_(future_result_t<future<int>_>_&)>::type>
  result_future;
  future<int> predecessor_future;
  undefined1 local_3d;
  undefined1 local_3c [4];
  future<int> local_38;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  element_type *local_18;
  
  std::
  async<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_1_>
            ((launch)local_28,(anon_class_1_0_00000001_for__M_head_impl *)0x3);
  has_then_execute_member::
  then_execute<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda(int&)_1_,int>
            ((has_then_execute_member *)&local_38,(anon_class_1_0_00000001_for_func *)&local_18,
             (future<int> *)local_3c);
  iVar1 = std::future<int>::get(&local_38);
  if (iVar1 != 2) {
    __assert_fail("2 == result_future.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                  ,0x5f,
                  "void test_then_execute(const Executor &) [Executor = has_then_execute_free_function]"
                 );
  }
  if (local_38.super___basic_future<int>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___basic_future<int>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  std::
  async<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_2_>
            ((launch)local_28,(anon_class_1_0_00000001_for__M_head_impl *)0x3);
  has_then_execute_member::
  then_execute<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_3_>
            ((has_then_execute_member *)&local_38,(anon_class_1_0_00000001_for_func *)&local_18,
             (future<void> *)local_3c);
  iVar1 = std::future<int>::get(&local_38);
  if (iVar1 == 1) {
    if (local_38.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___basic_future<int>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    std::
    async<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_4_>
              ((launch)local_28,(anon_class_1_0_00000001_for__M_head_impl *)0x3);
    local_3c = (undefined1  [4])0x0;
    f = (anon_class_8_1_6971b95b_for_func *)&local_3d;
    local_18 = (element_type *)local_3c;
    has_then_execute_member::
    then_execute<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda(int&)_2_,int>
              ((has_then_execute_member *)&local_38,f,(future<int> *)&local_18);
    if (local_38.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (_State_baseV2 *)0x0) {
      std::__throw_future_error(3);
    }
    else {
      std::__future_base::_State_baseV2::wait
                (local_38.super___basic_future<int>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,f);
      if (local_3c == (undefined1  [4])0x1) {
        if (local_38.super___basic_future<int>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_38.super___basic_future<int>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
        }
        std::
        async<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_5_>
                  ((launch)local_28,(anon_class_1_0_00000001_for__M_head_impl *)0x3);
        local_3c = (undefined1  [4])0x0;
        f_00 = (anon_class_8_1_f8e7f5fd_for_func *)&local_3d;
        local_18 = (element_type *)local_3c;
        has_then_execute_member::
        then_execute<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_6_>
                  ((has_then_execute_member *)&local_38,f_00,(future<void> *)&local_18);
        if (local_38.super___basic_future<int>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (_State_baseV2 *)0x0) {
          std::__throw_future_error(3);
        }
        else {
          std::__future_base::_State_baseV2::wait
                    (local_38.super___basic_future<int>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,f_00);
          if (local_3c == (undefined1  [4])0xd) {
            if (local_38.super___basic_future<int>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_38.super___basic_future<int>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
            }
            return;
          }
        }
        __assert_fail("13 == expect_thirteen",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                      ,0x91,
                      "void test_then_execute(const Executor &) [Executor = has_then_execute_free_function]"
                     );
      }
    }
    __assert_fail("1 == result",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                  ,0x7f,
                  "void test_then_execute(const Executor &) [Executor = has_then_execute_free_function]"
                 );
  }
  __assert_fail("1 == result_future.get()",
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                ,0x6d,
                "void test_then_execute(const Executor &) [Executor = has_then_execute_free_function]"
               );
}

Assistant:

void test_then_execute(const Executor& exec)
{
  {
    // non-void predecessor to non-void result

    std::future<int> predecessor_future = std::async([] { return 1; });

    auto result_future = std::experimental::execution::then_execute(exec, [](int& predecessor)
    {
      return 1 + predecessor;
    },
    predecessor_future
    );

    assert(2 == result_future.get());
  }

  {
    // void predecessor to non-void result
    std::future<void> predecessor_future = std::async([]{});

    auto result_future = std::experimental::execution::then_execute(exec, []
    {
      return 1;
    },
    predecessor_future
    );

    assert(1 == result_future.get());
  }

  {
    // non-void predecessor_future to void result

    std::future<int> predecessor_future = std::async([] { return 1; });

    int result = 0;
    auto result_future = std::experimental::execution::then_execute(exec, [&](int& predecessor)
    {
      result = predecessor;
    },
    predecessor_future
    );

    result_future.wait();

    assert(1 == result);
  }

  {
    // void predecessor_future to void result

    std::future<void> predecessor_future = std::async([]{});

    int expect_thirteen = 0;
    auto result_future = std::experimental::execution::then_execute(exec, [&]
    {
      expect_thirteen = 13;
    },
    predecessor_future
    );

    result_future.wait();

    assert(13 == expect_thirteen);
  }
}